

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageProvider.cpp
# Opt level: O2

void __thiscall
ImageProvider::prepareGraphicBoard(ImageProvider *this,QImage *image,size_t tileSize)

{
  _Head_base<0UL,_GraphicBoard_*,_false> __p;
  bool bVar1;
  __uniq_ptr_impl<GraphicBoard,_std::default_delete<GraphicBoard>_> *this_00;
  mapped_type *pmVar2;
  _Base_ptr p_Var3;
  ImageProvider *this_01;
  BoardSize boardSize;
  _Rb_tree_color local_4c;
  _Head_base<0UL,_GraphicBoard_*,_false> local_48;
  QImage *local_40;
  size_t local_38;
  
  local_40 = image;
  local_38 = tileSize;
  for (p_Var3 = (this->images)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->images)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    local_4c = p_Var3[1]._M_color;
    this_01 = (ImageProvider *)(ulong)local_4c;
    bVar1 = Options::isImageToBeLoaded(FOUR);
    if (bVar1) {
      bVar1 = checkImageSize(this_01,local_40,local_4c,local_38);
      if (bVar1) {
        std::make_unique<GraphicBoard>();
        this_00 = (__uniq_ptr_impl<GraphicBoard,_std::default_delete<GraphicBoard>_> *)
                  std::
                  map<BoardSize,_std::unique_ptr<GraphicBoard,_std::default_delete<GraphicBoard>_>,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_std::unique_ptr<GraphicBoard,_std::default_delete<GraphicBoard>_>_>_>_>
                  ::at(&this->images,&local_4c);
        __p._M_head_impl = local_48._M_head_impl;
        local_48._M_head_impl = (pointer)0x0;
        std::__uniq_ptr_impl<GraphicBoard,_std::default_delete<GraphicBoard>_>::reset
                  (this_00,__p._M_head_impl);
        std::unique_ptr<GraphicBoard,_std::default_delete<GraphicBoard>_>::~unique_ptr
                  ((unique_ptr<GraphicBoard,_std::default_delete<GraphicBoard>_> *)&local_48);
        pmVar2 = std::
                 map<BoardSize,_std::unique_ptr<GraphicBoard,_std::default_delete<GraphicBoard>_>,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_std::unique_ptr<GraphicBoard,_std::default_delete<GraphicBoard>_>_>_>_>
                 ::at(&this->images,&local_4c);
        GraphicBoard::createTilesFromImage
                  ((pmVar2->_M_t).
                   super___uniq_ptr_impl<GraphicBoard,_std::default_delete<GraphicBoard>_>._M_t.
                   super__Tuple_impl<0UL,_GraphicBoard_*,_std::default_delete<GraphicBoard>_>.
                   super__Head_base<0UL,_GraphicBoard_*,_false>._M_head_impl,local_40,local_4c,
                   local_38,Options::graphicMode);
      }
    }
  }
  return;
}

Assistant:

void ImageProvider::prepareGraphicBoard( QImage& image, size_t tileSize )
{
    for ( const auto boardSize : images | std::views::keys )
    {
        if (( Options::isImageToBeLoaded( boardSize )) && ( checkImageSize( image, boardSize, tileSize )))
        {
            images.at( boardSize ) = std::make_unique<GraphicBoard>();
            images.at( boardSize )->createTilesFromImage( image, boardSize, tileSize, Options::graphicMode );
        }
    }
}